

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDivKernel2D.cpp
# Opt level: O0

void TPZShapeHDivKernel2D<pzshape::TPZShapeLinear>::Shape
               (TPZVec<double> *pt,TPZShapeData *data,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *divphi)

{
  double dVar1;
  int64_t iVar2;
  double *pdVar3;
  long *in_RCX;
  long *in_RDX;
  TPZFMatrix<double> *in_RSI;
  int i;
  int nshape;
  int dim;
  TPZShapeData *in_stack_000012e8;
  TPZVec<double> *in_stack_000012f0;
  int local_2c;
  
  TPZShapeH1<pzshape::TPZShapeLinear>::Shape(in_stack_000012f0,in_stack_000012e8);
  (**(code **)(*in_RCX + 0x78))();
  iVar2 = TPZBaseMatrix::Rows((TPZBaseMatrix *)&in_RSI[0x3d].fPivot.super_TPZVec<int>.fNAlloc);
  (**(code **)(*in_RDX + 0x68))(in_RDX,2,(long)(int)iVar2);
  for (local_2c = 0; local_2c < (int)iVar2; local_2c = local_2c + 1) {
    pdVar3 = TPZFMatrix<double>::operator()(in_RSI,(int64_t)in_RDX,(int64_t)in_RCX);
    dVar1 = *pdVar3;
    pdVar3 = TPZFMatrix<double>::operator()(in_RSI,(int64_t)in_RDX,(int64_t)in_RCX);
    *pdVar3 = dVar1;
  }
  return;
}

Assistant:

void TPZShapeHDivKernel2D<TSHAPE>::Shape(TPZVec<REAL> &pt, TPZShapeData &data, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &divphi)
{

    const int dim = TSHAPE::Dimension;
    TPZShapeH1<TSHAPE>::Shape(pt,data);
    divphi.Zero();

    int nshape = data.fPhi.Rows();
    phi.Resize(2,nshape);

    switch (dim)
    {
    case 1:
        for (int i = 0; i < nshape; i++){
            phi(0,i) = data.fDPhi(0,i);
        }
        break;
    
    case 2:
        for (int i = 0; i < nshape; i++){
            phi(0,i) =  data.fDPhi(1,i);
            phi(1,i) = -data.fDPhi(0,i);
        }
        break;
    
    default:
        DebugStop();
        break;
    }


}